

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ClassMethodDeclarationSyntax::getChild
          (ClassMethodDeclarationSyntax *this,size_t index)

{
  long in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  ConstTokenOrSyntax *in_stack_ffffffffffffffb0;
  nullptr_t in_stack_ffffffffffffffb8;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc0;
  
  if (in_RDX == 0) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x50),in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 2) {
    not_null<slang::syntax::FunctionDeclarationSyntax_*>::get
              ((not_null<slang::syntax::FunctionDeclarationSyntax_*> *)(in_RSI + 0x88));
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax ClassMethodDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return &qualifiers;
        case 2: return declaration.get();
        default: return nullptr;
    }
}